

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

size_t zmCreateMont_deep(size_t no)

{
  ulong n_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long in_RDI;
  size_t n;
  size_t in_stack_ffffffffffffffb0;
  
  n_00 = in_RDI + 7U >> 3;
  sVar1 = zzMod_deep(n_00,n_00);
  sVar2 = zmFromMont_deep(in_stack_ffffffffffffffb0);
  sVar3 = zmToMont_deep(in_stack_ffffffffffffffb0);
  sVar4 = zmMulMont_deep(in_stack_ffffffffffffffb0);
  sVar5 = zmSqrMont_deep(in_stack_ffffffffffffffb0);
  sVar6 = zmInvMont_deep(0x16ad69);
  sVar7 = zmDivMont_deep(in_stack_ffffffffffffffb0);
  sVar1 = utilMax(7,sVar1,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7);
  return sVar1;
}

Assistant:

size_t zmCreateMont_deep(size_t no)
{
	const size_t n = W_OF_O(no);
	return utilMax(7,
		zzMod_deep(n, n),
		zmFromMont_deep(n),
		zmToMont_deep(n),
		zmMulMont_deep(n),
		zmSqrMont_deep(n),
		zmInvMont_deep(n),
		zmDivMont_deep(n));
}